

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

bool double_conversion::Advance<char*>(char **it,uc16 separator,int base,char **end)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  undefined2 in_register_00000032;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  pcVar2 = *it;
  if (CONCAT22(in_register_00000032,separator) == 0) {
    *it = pcVar2 + 1;
    bVar5 = pcVar2 + 1 == *(char **)CONCAT44(in_register_00000014,base);
  }
  else {
    iVar1 = (int)*pcVar2;
    bVar5 = 0xfffffff5 < iVar1 - 0x3aU;
    pcVar4 = pcVar2 + 1;
    *it = pcVar4;
    pcVar3 = *(char **)CONCAT44(in_register_00000014,base);
    if ((!bVar5 || iVar1 >= 0x38) || pcVar4 == pcVar3) {
      return bVar5 && iVar1 < 0x38 || pcVar4 == pcVar3;
    }
    pcVar2 = pcVar2 + 2;
    if (pcVar2 == pcVar3) {
      return false;
    }
    if (((int)*pcVar4 == CONCAT22(in_register_00000032,separator)) &&
       ((int)*pcVar2 - 0x30U < 10 && *pcVar2 < 0x38)) {
      *it = pcVar2;
      pcVar3 = *(char **)CONCAT44(in_register_00000014,base);
      pcVar4 = pcVar2;
    }
    bVar5 = pcVar4 == pcVar3;
  }
  return bVar5;
}

Assistant:

static bool Advance (Iterator* it, uc16 separator, int base, Iterator& end) {
  if (separator == StringToDoubleConverter::kNoSeparator) {
    ++(*it);
    return *it == end;
  }
  if (!isDigit(**it, base)) {
    ++(*it);
    return *it == end;
  }
  ++(*it);
  if (*it == end) return true;
  if (*it + 1 == end) return false;
  if (**it == separator && isDigit(*(*it + 1), base)) {
    ++(*it);
  }
  return *it == end;
}